

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_reader.cpp
# Opt level: O1

bool __thiscall Json::Reader::readObject(Reader *this,Token *token)

{
  TokenType TVar1;
  bool bVar2;
  _Elt_pointer ppVVar3;
  byte unaff_R12B;
  char cVar4;
  Value numberName;
  String name;
  Token colon;
  Token comma;
  Token tokenName;
  Value init;
  ValueHolder local_f0 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  String local_c8;
  String local_a8;
  Token local_88;
  Token local_70;
  Value local_58;
  
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  local_c8._M_string_length = 0;
  local_c8.field_2._M_local_buf[0] = '\0';
  Value::Value(&local_58,objectValue);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::swapPayload(ppVVar3[-1],&local_58);
  ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
            _M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (ppVVar3 ==
      (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    ppVVar3 = (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  Value::setOffsetStart(ppVVar3[-1],(long)token->start_ - (long)this->begin_);
  do {
    bVar2 = readToken(this,&local_70);
    if (!bVar2) goto LAB_0087ceb5;
    bVar2 = true;
    while ((TVar1 = local_70.type_, bVar2 != false && (local_70.type_ == tokenComment))) {
      bVar2 = readToken(this,&local_70);
    }
    if (bVar2 == false) goto LAB_0087ccff;
    cVar4 = '\x01';
    if ((local_70.type_ == tokenObjectEnd) && (local_c8._M_string_length == 0)) {
      unaff_R12B = 1;
    }
    else {
      local_c8._M_string_length = 0;
      *local_c8._M_dataplus._M_p = '\0';
      if (TVar1 == tokenNumber) {
        if ((this->features_).allowNumericKeys_ != true) goto LAB_0087ccff;
        Value::Value((Value *)local_f0,nullValue);
        bVar2 = decodeNumber(this,&local_70,(Value *)local_f0);
        if (bVar2) {
          Value::asString_abi_cxx11_(&local_a8,(Value *)local_f0);
          std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p) !=
              &local_a8.field_2) {
            operator_delete((undefined1 *)
                            CONCAT44(local_a8._M_dataplus._M_p._4_4_,(int)local_a8._M_dataplus._M_p)
                            ,local_a8.field_2._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
          unaff_R12B = 0;
        }
        Value::~Value((Value *)local_f0);
        if (bVar2) goto LAB_0087cd2e;
      }
      else if (TVar1 == tokenString) {
        bVar2 = decodeString(this,&local_70,&local_c8);
        if (bVar2) {
LAB_0087cd2e:
          bVar2 = readToken(this,(Token *)&local_a8);
          if (bVar2 && (int)local_a8._M_dataplus._M_p == 0xb) {
            ppVVar3 = (this->nodes_).c.
                      super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_cur;
            if (ppVVar3 ==
                (this->nodes_).c.super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>.
                _M_impl.super__Deque_impl_data._M_finish._M_first) {
              ppVVar3 = (this->nodes_).c.
                        super__Deque_base<Json::Value_*,_std::allocator<Json::Value_*>_>._M_impl.
                        super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
            }
            local_f0[0].map_ = (ObjectValues *)Value::operator[](ppVVar3[-1],&local_c8);
            std::deque<Json::Value*,std::allocator<Json::Value*>>::emplace_back<Json::Value*>
                      ((deque<Json::Value*,std::allocator<Json::Value*>> *)this,
                       (Value **)&local_f0[0].map_);
            bVar2 = readValue(this);
            std::deque<Json::Value_*,_std::allocator<Json::Value_*>_>::pop_back
                      ((deque<Json::Value_*,_std::allocator<Json::Value_*>_> *)this);
            if (!bVar2) {
              recoverFromError(this,tokenObjectEnd);
              goto LAB_0087ce97;
            }
            bVar2 = readToken(this,&local_88);
            if (((bVar2) && (local_88.type_ < tokenError)) &&
               ((0x1404U >> (local_88.type_ & 0x1f) & 1) != 0)) {
              bVar2 = true;
              while ((bVar2 != false && (local_88.type_ == tokenComment))) {
                bVar2 = readToken(this,&local_88);
              }
              cVar4 = local_88.type_ == tokenObjectEnd;
              unaff_R12B = unaff_R12B | cVar4;
              goto LAB_0087cd04;
            }
            local_f0[0].string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"Missing \',\' or \'}\' in object declaration","");
            addError(this,(String *)local_f0,&local_88,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          else {
            local_f0[0].string_ = (char *)&local_e0;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_f0,"Missing \':\' after object member name","");
            addError(this,(String *)local_f0,(Token *)&local_a8,(Location)0x0);
            recoverFromError(this,tokenObjectEnd);
          }
          if (local_f0[0] != &local_e0) {
            operator_delete(local_f0[0].string_,local_e0._M_allocated_capacity + 1);
          }
        }
        else {
          recoverFromError(this,tokenObjectEnd);
        }
LAB_0087ce97:
        cVar4 = '\x01';
        unaff_R12B = 0;
      }
      else {
LAB_0087ccff:
        cVar4 = '\x03';
      }
    }
LAB_0087cd04:
  } while (cVar4 == '\0');
  if (cVar4 == '\x03') {
LAB_0087ceb5:
    local_f0[0].string_ = (char *)&local_e0;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_f0,"Missing \'}\' or object member name","");
    addError(this,(String *)local_f0,&local_70,(Location)0x0);
    recoverFromError(this,tokenObjectEnd);
    if (local_f0[0] != &local_e0) {
      operator_delete(local_f0[0].string_,local_e0._M_allocated_capacity + 1);
    }
    unaff_R12B = 0;
  }
  Value::~Value(&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,
                    CONCAT71(local_c8.field_2._M_allocated_capacity._1_7_,
                             local_c8.field_2._M_local_buf[0]) + 1);
  }
  return (bool)(unaff_R12B & 1);
}

Assistant:

bool Reader::readObject(Token& token) {
  Token tokenName;
  String name;
  Value init(objectValue);
  currentValue().swapPayload(init);
  currentValue().setOffsetStart(token.start_ - begin_);
  while (readToken(tokenName)) {
    bool initialTokenOk = true;
    while (tokenName.type_ == tokenComment && initialTokenOk)
      initialTokenOk = readToken(tokenName);
    if (!initialTokenOk)
      break;
    if (tokenName.type_ == tokenObjectEnd && name.empty()) // empty object
      return true;
    name.clear();
    if (tokenName.type_ == tokenString) {
      if (!decodeString(tokenName, name))
        return recoverFromError(tokenObjectEnd);
    } else if (tokenName.type_ == tokenNumber && features_.allowNumericKeys_) {
      Value numberName;
      if (!decodeNumber(tokenName, numberName))
        return recoverFromError(tokenObjectEnd);
      name = numberName.asString();
    } else {
      break;
    }

    Token colon;
    if (!readToken(colon) || colon.type_ != tokenMemberSeparator) {
      return addErrorAndRecover("Missing ':' after object member name", colon,
                                tokenObjectEnd);
    }
    Value& value = currentValue()[name];
    nodes_.push(&value);
    bool ok = readValue();
    nodes_.pop();
    if (!ok) // error already set
      return recoverFromError(tokenObjectEnd);

    Token comma;
    if (!readToken(comma) ||
        (comma.type_ != tokenObjectEnd && comma.type_ != tokenArraySeparator &&
         comma.type_ != tokenComment)) {
      return addErrorAndRecover("Missing ',' or '}' in object declaration",
                                comma, tokenObjectEnd);
    }
    bool finalizeTokenOk = true;
    while (comma.type_ == tokenComment && finalizeTokenOk)
      finalizeTokenOk = readToken(comma);
    if (comma.type_ == tokenObjectEnd)
      return true;
  }
  return addErrorAndRecover("Missing '}' or object member name", tokenName,
                            tokenObjectEnd);
}